

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

CharPtr __thiscall fmt::BasicWriter<char>::grow_buffer(BasicWriter<char> *this,size_t n)

{
  size_t sVar1;
  
  sVar1 = this->buffer_->size_;
  Buffer<char>::resize(this->buffer_,n + sVar1);
  return this->buffer_->ptr_ + sVar1;
}

Assistant:

CharPtr grow_buffer(std::size_t n) {
    std::size_t size = buffer_.size();
    buffer_.resize(size + n);
    return internal::make_ptr(&buffer_[size], n);
  }